

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O0

void rsg::anon_unknown_18::deleteVectorElements<rsg::ShaderInput>
               (vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *vec)

{
  ShaderInput *this;
  bool bVar1;
  reference ppSVar2;
  __normal_iterator<rsg::ShaderInput_**,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
  local_20;
  __normal_iterator<rsg::ShaderInput_**,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
  local_18;
  iterator i;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *vec_local;
  
  i._M_current = (ShaderInput **)vec;
  local_18._M_current =
       (ShaderInput **)
       std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::begin(vec);
  while( true ) {
    local_20._M_current =
         (ShaderInput **)
         std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::end(i._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<rsg::ShaderInput_**,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
              ::operator*(&local_18);
    this = *ppSVar2;
    if (this != (ShaderInput *)0x0) {
      ShaderInput::~ShaderInput(this);
      operator_delete(this,0x38);
    }
    __gnu_cxx::
    __normal_iterator<rsg::ShaderInput_**,_std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>_>
    ::operator++(&local_18,0);
  }
  std::vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>::clear
            ((vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *)i._M_current);
  return;
}

Assistant:

void deleteVectorElements (std::vector<T*>& vec)
{
	for (typename std::vector<T*>::iterator i = vec.begin(); i != vec.end(); i++)
		delete *i;
	vec.clear();
}